

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O3

bool __thiscall
QSqlTableModel::removeRows(QSqlTableModel *this,int row,int count,QModelIndex *parent)

{
  QSqlRecord *this_00;
  Op OVar1;
  long lVar2;
  QSqlRecordPrivate **this_01;
  QSqlRecordPrivate **this_02;
  QSqlRecord QVar3;
  undefined1 uVar4;
  int iVar5;
  ModifiedRow *pMVar6;
  uint uVar7;
  QSqlRecord *this_03;
  int iVar8;
  long in_FS_OFFSET;
  bool bVar9;
  int local_8c;
  QSqlQueryModel local_88;
  ModifiedRow local_78;
  ModifiedRow local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar9 = false;
  if ((-1 < parent->r) && (-1 < parent->c)) {
    bVar9 = (parent->m).ptr != (QAbstractItemModel *)0x0;
  }
  local_88._12_4_ = row;
  if (((0 < count) && (-1 < row)) && (!bVar9)) {
    lVar2 = *(long *)&(this->super_QSqlQueryModel).field_0x8;
    iVar8 = row + count;
    local_58._0_8_ = 0xffffffffffffffff;
    local_58.m_rec.d.d.ptr =
         (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
         (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0;
    local_58.m_db_values.d.d.ptr =
         (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
         (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0;
    iVar5 = (**(code **)(*(long *)&this->super_QSqlQueryModel + 0x78))(this);
    if (iVar8 <= iVar5) {
      if (*(int *)(lVar2 + 0x238) != 2) {
        if (1 < (uint)count) goto LAB_0013c270;
        QSqlRecord::QSqlRecord((QSqlRecord *)&local_88);
        this_01 = (QSqlRecordPrivate **)&local_78.m_rec;
        local_78._0_8_ = local_78._0_8_ & 0xffffffff00000000;
        QSqlRecord::QSqlRecord((QSqlRecord *)this_01);
        this_02 = (QSqlRecordPrivate **)&local_78.m_db_values;
        QSqlRecord::QSqlRecord((QSqlRecord *)this_02,(QSqlRecord *)&local_88);
        local_78.m_submitted = true;
        local_78.m_insert = false;
        if (local_78.m_op != None) {
          local_78._0_8_ = local_78._0_8_ & 0xffffffff00000000;
          QSqlRecord::operator=((QSqlRecord *)this_01,(QSqlRecord *)this_02);
          OVar1 = local_78.m_op;
          iVar5 = QSqlRecord::count((QSqlRecord *)this_01);
          if (0 < iVar5) {
            uVar7 = iVar5 + 1;
            do {
              QSqlRecord::setGenerated((QSqlRecord *)this_01,uVar7 - 2,OVar1 == Delete);
              uVar7 = uVar7 - 1;
            } while (1 < uVar7);
          }
        }
        QMap<int,_QSqlTableModelPrivate::ModifiedRow>::value
                  (&local_58,(QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)(lVar2 + 0x2e0),
                   (int *)&local_88.field_0xc,&local_78);
        if (local_58.m_submitted == true) {
          bVar9 = isDirty(this);
          QSqlRecord::~QSqlRecord(&local_58.m_db_values);
          QSqlRecord::~QSqlRecord(&local_58.m_rec);
          QSqlRecord::~QSqlRecord((QSqlRecord *)this_02);
          QSqlRecord::~QSqlRecord((QSqlRecord *)this_01);
          QSqlRecord::~QSqlRecord((QSqlRecord *)&local_88);
          if (bVar9) goto LAB_0013c270;
        }
        else {
          QSqlRecord::~QSqlRecord(&local_58.m_db_values);
          QSqlRecord::~QSqlRecord(&local_58.m_rec);
          QSqlRecord::~QSqlRecord((QSqlRecord *)this_02);
          QSqlRecord::~QSqlRecord((QSqlRecord *)this_01);
          QSqlRecord::~QSqlRecord((QSqlRecord *)&local_88);
        }
        iVar8 = count + local_88._12_4_;
      }
      this_00 = &local_58.m_rec;
      local_8c = iVar8 + -1;
      do {
        pMVar6 = QMap<int,_QSqlTableModelPrivate::ModifiedRow>::operator[]
                           ((QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)(lVar2 + 0x2e0),
                            &local_8c);
        OVar1 = pMVar6->m_op;
        if (OVar1 == None) {
          QSqlQueryModel::record(&local_88,(Orientation)this);
          local_58._0_8_ = local_58._0_8_ & 0xffffffff00000000;
          QSqlRecord::QSqlRecord(this_00);
          QSqlRecord::QSqlRecord(&local_58.m_db_values,(QSqlRecord *)&local_88);
          local_58._24_2_ = local_58._24_2_ & 0xff;
          if (local_58.m_op != Delete) {
            local_58.m_submitted = false;
            local_58.m_insert = false;
            local_58.m_op = 3;
            QSqlRecord::operator=(this_00,&local_58.m_db_values);
            OVar1 = local_58.m_op;
            iVar5 = QSqlRecord::count(this_00);
            if (0 < iVar5) {
              uVar7 = iVar5 + 1;
              do {
                QSqlRecord::setGenerated(this_00,uVar7 - 2,OVar1 == Delete);
                uVar7 = uVar7 - 1;
              } while (1 < uVar7);
            }
          }
          QVar3.d.d.ptr = local_58.m_rec.d.d.ptr;
          pMVar6->m_op = local_58.m_op;
          local_58.m_rec.d.d.ptr =
               (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
               (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0;
          local_78._0_8_ = (pMVar6->m_rec).d.d.ptr;
          (pMVar6->m_rec).d.d.ptr = (QSqlRecordPrivate *)QVar3.d.d.ptr;
          QSqlRecord::~QSqlRecord((QSqlRecord *)&local_78);
          QVar3.d.d.ptr = local_58.m_db_values.d.d.ptr;
          local_58.m_db_values.d.d.ptr =
               (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
               (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0;
          local_78._0_8_ = (pMVar6->m_db_values).d.d.ptr;
          (pMVar6->m_db_values).d.d.ptr = (QSqlRecordPrivate *)QVar3.d.d.ptr;
          QSqlRecord::~QSqlRecord((QSqlRecord *)&local_78);
          pMVar6->m_submitted = local_58.m_submitted;
          pMVar6->m_insert = local_58.m_insert;
          QSqlRecord::~QSqlRecord(&local_58.m_db_values);
          QSqlRecord::~QSqlRecord(this_00);
          QSqlRecord::~QSqlRecord((QSqlRecord *)&local_88);
LAB_0013c58a:
          if (*(int *)(lVar2 + 0x238) == 2) {
            QAbstractItemModel::headerDataChanged((Orientation)this,2,local_8c);
          }
        }
        else {
          if (OVar1 == Delete) goto LAB_0013c58a;
          if (OVar1 != Insert) {
            pMVar6->m_submitted = false;
            pMVar6->m_op = Delete;
            this_03 = &pMVar6->m_rec;
            QSqlRecord::operator=(this_03,&pMVar6->m_db_values);
            OVar1 = pMVar6->m_op;
            iVar5 = QSqlRecord::count(this_03);
            if (0 < iVar5) {
              uVar7 = iVar5 + 1;
              do {
                QSqlRecord::setGenerated(this_03,uVar7 - 2,OVar1 == Delete);
                uVar7 = uVar7 - 1;
              } while (1 < uVar7);
            }
            goto LAB_0013c58a;
          }
          (**(code **)(*(long *)&this->super_QSqlQueryModel + 0x1c0))(this,local_8c);
        }
        iVar5 = local_8c + -1;
        bVar9 = (int)local_88._12_4_ < local_8c;
        local_8c = iVar5;
      } while (bVar9);
      uVar4 = 1;
      if (*(int *)(lVar2 + 0x238) != 2) {
        uVar4 = (**(code **)(*(long *)&this->super_QSqlQueryModel + 0x170))(this);
      }
      goto LAB_0013c272;
    }
  }
LAB_0013c270:
  uVar4 = 0;
LAB_0013c272:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)uVar4;
}

Assistant:

bool QSqlTableModel::removeRows(int row, int count, const QModelIndex &parent)
{
    Q_D(QSqlTableModel);
    if (parent.isValid() || row < 0 || count <= 0 || row + count > rowCount())
        return false;

    if (d->strategy != OnManualSubmit)
        if (count > 1 || (d->cache.value(row).submitted() && isDirty()))
            return false;

    // Iterate backwards so we don't have to worry about removed rows causing
    // higher cache entries to shift downwards.
    for (int idx = row + count - 1; idx >= row; --idx) {
        QSqlTableModelPrivate::ModifiedRow& mrow = d->cache[idx];
        if (mrow.op() == QSqlTableModelPrivate::Insert) {
            revertRow(idx);
        } else {
            if (mrow.op() == QSqlTableModelPrivate::None)
                mrow = QSqlTableModelPrivate::ModifiedRow(QSqlTableModelPrivate::Delete,
                                                          QSqlQueryModel::record(idx));
            else
                mrow.setOp(QSqlTableModelPrivate::Delete);
            if (d->strategy == OnManualSubmit)
                emit headerDataChanged(Qt::Vertical, idx, idx);
        }
    }

    if (d->strategy != OnManualSubmit)
        return submit();

    return true;
}